

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

Vec_Int_t * Saig_ManCbaFindReason(Saig_ManCba_t *p)

{
  undefined1 *puVar1;
  Abc_Cex_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *vPrios;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  Vec_Int_t *vReasons;
  byte bVar9;
  uint uVar10;
  int iVar11;
  Aig_Man_t *p_00;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint local_38;
  
  iVar14 = p->pFrames->vObjs->nSize;
  vPrios = Vec_IntAlloc(iVar14);
  vPrios->nSize = iVar14;
  if (vPrios->pArray != (int *)0x0) {
    memset(vPrios->pArray,0xff,(long)iVar14 << 2);
  }
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  iVar11 = 0;
  iVar14 = 1;
  while( true ) {
    p_00 = p->pFrames;
    if (p_00->vCis->nSize <= iVar11) break;
    pvVar7 = Vec_PtrEntry(p_00->vCis,iVar11);
    iVar5 = Vec_IntEntry(p->vMapPiF2A,iVar14 + -1);
    iVar6 = Vec_IntEntry(p->vMapPiF2A,iVar14);
    pAVar2 = p->pCex;
    iVar5 = iVar5 + pAVar2->nRegs + iVar6 * pAVar2->nPis;
    *(ulong *)((long)pvVar7 + 0x18) =
         (*(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffff7) +
         (ulong)((uint)(&pAVar2[1].iPo)[iVar5 >> 5] >> ((byte)iVar5 & 0x1f) & 1) * 8;
    Vec_IntWriteEntry(vPrios,*(int *)((long)pvVar7 + 0x24),iVar11);
    iVar11 = iVar11 + 1;
    iVar14 = iVar14 + 2;
  }
  for (iVar14 = 0; iVar14 < p_00->vObjs->nSize; iVar14 = iVar14 + 1) {
    pvVar7 = Vec_PtrEntry(p_00->vObjs,iVar14);
    if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
      uVar3 = *(ulong *)((long)pvVar7 + 8);
      iVar11 = -1;
      if (uVar3 != 0) {
        iVar11 = *(int *)((uVar3 & 0xfffffffffffffffe) + 0x24);
      }
      uVar4 = *(ulong *)((long)pvVar7 + 0x10);
      uVar12 = *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x18);
      uVar10 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x18);
      iVar5 = Vec_IntEntry(vPrios,iVar11);
      iVar11 = -1;
      if (*(ulong *)((long)pvVar7 + 0x10) != 0) {
        iVar11 = *(int *)((*(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe) + 0x24);
      }
      uVar13 = (uint)uVar3 & 1;
      uVar12 = uVar12 >> 3 & 1;
      iVar11 = Vec_IntEntry(vPrios,iVar11);
      local_38 = (uint)uVar4;
      local_38 = uVar10 >> 3 ^ local_38;
      bVar9 = (byte)local_38 & uVar13 != uVar12;
      *(ulong *)((long)pvVar7 + 0x18) =
           (*(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffff7) + (ulong)bVar9 * 8;
      if (bVar9 == 1) {
        if (iVar11 < iVar5) {
          iVar11 = iVar5;
        }
        Vec_IntWriteEntry(vPrios,*(int *)((long)pvVar7 + 0x24),iVar11);
      }
      else {
        local_38 = local_38 & 1;
        if ((uVar13 == uVar12) && (local_38 != 0)) {
          Vec_IntWriteEntry(vPrios,*(int *)((long)pvVar7 + 0x24),iVar5);
        }
        else {
          if (((uVar13 == uVar12) || (local_38 != 0)) && (iVar5 < iVar11)) {
            iVar11 = iVar5;
          }
          Vec_IntWriteEntry(vPrios,*(int *)((long)pvVar7 + 0x24),iVar11);
        }
      }
    }
    p_00 = p->pFrames;
  }
  pAVar8 = Aig_ManCo(p_00,0);
  uVar10 = (int)pAVar8->pFanin0 * 8 & 8;
  uVar12 = *(uint *)(((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe) + 0x18) & 8;
  *(ulong *)&pAVar8->field_0x18 =
       *(ulong *)&pAVar8->field_0x18 & 0xfffffffffffffff7 | (ulong)(uVar10 ^ uVar12);
  if (uVar12 != uVar10) {
    __assert_fail("!pObj->fPhase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x15c,"Vec_Int_t *Saig_ManCbaFindReason(Saig_ManCba_t *)");
  }
  vReasons = Vec_IntAlloc(100);
  Aig_ManIncrementTravId(p->pFrames);
  Saig_ManCbaFindReason_rec
            (p->pFrames,(Aig_Obj_t *)((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe),vPrios,vReasons);
  Vec_IntFree(vPrios);
  return vReasons;
}

Assistant:

Vec_Int_t * Saig_ManCbaFindReason( Saig_ManCba_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vReasons;
    int i;

    // set PI values according to CEX
    vPrios = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    pObj->fPhase = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
    assert( !pObj->fPhase );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    Saig_ManCbaFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
//    assert( !Aig_ObjIsTravIdCurrent(p->pFrames, Aig_ManConst1(p->pFrames)) );
    return vReasons;
}